

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cab_session.cpp
# Opt level: O2

void __thiscall cab_session::handle_receive(cab_session *this)

{
  state_type sVar1;
  socket_type sVar2;
  service_type *psVar3;
  error_category *peVar4;
  bool bVar5;
  undefined3 uVar6;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  reactive_socket_recv_op<boost::asio::mutable_buffers_1,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Stazer[P]autonomouscabs_backend_cab_session_cpp:31:67),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  *op;
  anon_class_24_2_3fe5b907 local_58;
  ptr local_40;
  shared_ptr<cab_session> self;
  
  std::__shared_ptr<cab_session,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<cab_session,void>
            ((__shared_ptr<cab_session,(__gnu_cxx::_Lock_policy)2> *)
             &self.super___shared_ptr<cab_session,_(__gnu_cxx::_Lock_policy)2>,
             (__weak_ptr<cab_session,_(__gnu_cxx::_Lock_policy)2> *)this);
  local_58.this = this;
  std::__shared_ptr<cab_session,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_58.self.super___shared_ptr<cab_session,_(__gnu_cxx::_Lock_policy)2>,
             &self.super___shared_ptr<cab_session,_(__gnu_cxx::_Lock_policy)2>);
  psVar3 = (this->_socket).
           super_basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
           .impl_.service_;
  local_40.h = &local_58;
  op = (reactive_socket_recv_op<boost::asio::mutable_buffers_1,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Stazer[P]autonomouscabs_backend_cab_session_cpp:31:67),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
        *)boost::asio::asio_handler_allocate(0xa0);
  _Var7._M_pi = local_58.self.super___shared_ptr<cab_session,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
  sVar2 = (this->_socket).
          super_basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
          .impl_.implementation_.super_base_implementation_type.socket_;
  sVar1 = (this->_socket).
          super_basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
          .impl_.implementation_.super_base_implementation_type.state_;
  (op->super_reactive_socket_recv_op_base<boost::asio::mutable_buffers_1>).super_reactor_op.
  super_operation.next_ = (scheduler_operation *)0x0;
  (op->super_reactive_socket_recv_op_base<boost::asio::mutable_buffers_1>).super_reactor_op.
  super_operation.func_ =
       boost::asio::detail::
       reactive_socket_recv_op<boost::asio::mutable_buffers_1,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Stazer[P]autonomouscabs/backend/cab_session.cpp:31:67),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
       ::do_complete;
  (op->super_reactive_socket_recv_op_base<boost::asio::mutable_buffers_1>).super_reactor_op.
  super_operation.task_result_ = 0;
  bVar5 = (psVar3->super_reactive_socket_service_base).success_ec_.failed_;
  uVar6 = *(undefined3 *)&(psVar3->super_reactive_socket_service_base).success_ec_.field_0x5;
  peVar4 = (psVar3->super_reactive_socket_service_base).success_ec_.cat_;
  (op->super_reactive_socket_recv_op_base<boost::asio::mutable_buffers_1>).super_reactor_op.ec_.val_
       = (psVar3->super_reactive_socket_service_base).success_ec_.val_;
  (op->super_reactive_socket_recv_op_base<boost::asio::mutable_buffers_1>).super_reactor_op.ec_.
  failed_ = bVar5;
  *(undefined3 *)
   &(op->super_reactive_socket_recv_op_base<boost::asio::mutable_buffers_1>).super_reactor_op.ec_.
    field_0x5 = uVar6;
  (op->super_reactive_socket_recv_op_base<boost::asio::mutable_buffers_1>).super_reactor_op.ec_.cat_
       = peVar4;
  (op->super_reactive_socket_recv_op_base<boost::asio::mutable_buffers_1>).super_reactor_op.
  bytes_transferred_ = 0;
  (op->super_reactive_socket_recv_op_base<boost::asio::mutable_buffers_1>).super_reactor_op.
  perform_func_ =
       boost::asio::detail::reactive_socket_recv_op_base<boost::asio::mutable_buffers_1>::do_perform
  ;
  (op->super_reactive_socket_recv_op_base<boost::asio::mutable_buffers_1>).socket_ = sVar2;
  (op->super_reactive_socket_recv_op_base<boost::asio::mutable_buffers_1>).state_ = sVar1;
  (op->super_reactive_socket_recv_op_base<boost::asio::mutable_buffers_1>).buffers_.
  super_mutable_buffer.data_ = &this->_receive_buffer;
  (op->super_reactive_socket_recv_op_base<boost::asio::mutable_buffers_1>).buffers_.
  super_mutable_buffer.size_ = 0x400;
  (op->super_reactive_socket_recv_op_base<boost::asio::mutable_buffers_1>).flags_ = 0;
  (op->handler_).this = local_58.this;
  (op->handler_).self.super___shared_ptr<cab_session,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_58.self.super___shared_ptr<cab_session,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_58.self.super___shared_ptr<cab_session,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (op->handler_).self.super___shared_ptr<cab_session,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = _Var7._M_pi;
  local_58.self.super___shared_ptr<cab_session,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_40.v = op;
  boost::asio::detail::
  handler_work_base<boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_void,_boost::asio::io_context,_boost::asio::executor,_void>
  ::handler_work_base(&(op->work_).
                       super_handler_work_base<boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_void,_boost::asio::io_context,_boost::asio::executor,_void>
                      ,&(this->_socket).
                        super_basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                        .impl_.executor_);
  local_40.p = op;
  boost::asio::detail::reactive_socket_service_base::start_op
            (&psVar3->super_reactive_socket_service_base,
             &(this->_socket).
              super_basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
              .impl_.implementation_.super_base_implementation_type,0,(reactor_op *)op,false,true,
             false);
  local_40.v = (reactive_socket_recv_op<boost::asio::mutable_buffers_1,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Stazer[P]autonomouscabs_backend_cab_session_cpp:31:67),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                *)0x0;
  local_40.p = (reactive_socket_recv_op<boost::asio::mutable_buffers_1,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Stazer[P]autonomouscabs_backend_cab_session_cpp:31:67),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                *)0x0;
  boost::asio::detail::
  reactive_socket_recv_op<boost::asio::mutable_buffers_1,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Stazer[P]autonomouscabs/backend/cab_session.cpp:31:67),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::ptr::~ptr(&local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_58.self.super___shared_ptr<cab_session,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&self.super___shared_ptr<cab_session,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void cab_session::handle_receive()
{
    auto self = shared_from_this();
    _socket.async_read_some(boost::asio::buffer(_receive_buffer), [this, self](boost::system::error_code error_code, std::size_t length)
    {
        if(!error_code)
        {
            _buffer.insert(_buffer.end(), _receive_buffer.begin(), _receive_buffer.begin() + length);
            _handle_buffer();
        }
    });
}